

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  istream *piVar3;
  ulong *puVar4;
  void *__s;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int b;
  int a;
  size_t k;
  int n;
  int local_40;
  int local_3c;
  long local_38;
  int local_2c;
  
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_2c);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_3c);
  puVar4 = (ulong *)std::istream::operator>>(piVar3,&local_40);
  std::istream::_M_extract<unsigned_long>(puVar4);
  lVar8 = (long)local_2c;
  uVar6 = 0xffffffffffffffff;
  if (-1 < lVar8) {
    uVar6 = lVar8 * 4;
  }
  __s = operator_new__(uVar6);
  memset(__s,0,uVar6);
  auVar2 = _DAT_00102020;
  if (0 < lVar8) {
    lVar7 = lVar8 + -1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00102020;
    auVar10 = _DAT_00102010;
    do {
      auVar11 = auVar10 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        *(int *)((long)__s + uVar6 * 4) = (int)uVar6;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *(int *)((long)__s + uVar6 * 4 + 4) = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
    } while ((local_2c + 1U & 0xfffffffe) != uVar6);
  }
  pvVar1 = (void *)((long)__s + (long)local_3c * 4);
  std::_V2::__rotate<int*>
            (pvVar1,(void *)((long)pvVar1 + local_38 * 4),(void *)((long)__s + (long)local_40 * 4));
  if (local_2c != 0) {
    lVar7 = 0;
    do {
      poVar5 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)__s + lVar7));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      lVar7 = lVar7 + 4;
    } while (lVar8 * 4 - lVar7 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  operator_delete__(__s);
  return 0;
}

Assistant:

int main() {
  int n,a,b;
  size_t k;
  cin >> n >> a >> b >> k;
  CP::vector<int> v(n);
  for (int i = 0;i < n;i++) v[i] = i;
  v.rotate(v.begin() + a, v.begin() + b,k);
  for (auto &x : v) cout << x << " ";
  cout << endl;
}